

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O3

void __thiscall Kumu::PathMatchRegex::PathMatchRegex(PathMatchRegex *this,string *s)

{
  int __errcode;
  ILogSink *this_00;
  regex_t *__preg;
  char buf [128];
  char acStack_98 [136];
  
  (this->super_IPathMatch)._vptr_IPathMatch = (_func_int **)&PTR__PathMatchRegex_00124900;
  __preg = &this->m_regex;
  __errcode = regcomp((regex_t *)__preg,(s->_M_dataplus)._M_p,8);
  if (__errcode != 0) {
    regerror(__errcode,(regex_t *)__preg,acStack_98,0x80);
    this_00 = DefaultLogSink();
    ILogSink::Error(this_00,"PathMatchRegex: %s\n",acStack_98);
    regfree((regex_t *)__preg);
  }
  return;
}

Assistant:

Kumu::PathMatchRegex::PathMatchRegex(const std::string& s)
{
  int result = regcomp(&m_regex, s.c_str(), REG_NOSUB); // (REG_EXTENDED|REG_NOSUB|REG_NEWLINE));

  if ( result )
    {
      char buf[128];
      regerror(result, &m_regex, buf, 128);
      DefaultLogSink().Error("PathMatchRegex: %s\n", buf);
      regfree(&m_regex);
    }
}